

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_hist.c
# Opt level: O2

void show_rate_histogram(rate_hist *hist,aom_codec_enc_cfg_t *cfg,int max_buckets)

{
  hist_bucket *bucket;
  undefined8 *puVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  int local_24;
  
  if (cfg == (aom_codec_enc_cfg_t *)0x0 || hist == (rate_hist *)0x0) {
    return;
  }
  bucket = hist->bucket;
  local_24 = 0;
  for (lVar4 = 0x18; lVar4 != 0x4c8; lVar4 = lVar4 + 0xc) {
    iVar3 = local_24;
    if (*(int *)((long)&((rate_hist *)(hist->bucket + -2))->pts + lVar4) != 0x7fffffff) {
      puVar1 = (undefined8 *)((long)&((rate_hist *)(hist->bucket + -2))->pts + lVar4);
      iVar3 = local_24 + 1;
      hist->bucket[local_24].count = *(int *)(puVar1 + 1);
      uVar2 = *puVar1;
      bucket[local_24].low = (int)uVar2;
      bucket[local_24].high = (int)((ulong)uVar2 >> 0x20);
    }
    local_24 = iVar3;
  }
  fprintf(_stderr,"\nRate (over %dms window):\n",(ulong)cfg->rc_buf_sz);
  iVar3 = merge_hist_buckets(bucket,max_buckets,&local_24);
  show_histogram(bucket,local_24,hist->total,iVar3);
  return;
}

Assistant:

void show_rate_histogram(struct rate_hist *hist, const aom_codec_enc_cfg_t *cfg,
                         int max_buckets) {
  int i, scale;
  int buckets = 0;

  if (hist == NULL || cfg == NULL) return;

  for (i = 0; i < RATE_BINS; i++) {
    if (hist->bucket[i].low == INT_MAX) continue;
    hist->bucket[buckets++] = hist->bucket[i];
  }

  fprintf(stderr, "\nRate (over %dms window):\n", cfg->rc_buf_sz);
  scale = merge_hist_buckets(hist->bucket, max_buckets, &buckets);
  show_histogram(hist->bucket, buckets, hist->total, scale);
}